

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O2

size_t ZSTD_compressBlock_lazy2_extDict
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  long *plVar1;
  BYTE *iEnd;
  long *ilimit_w;
  undefined8 *puVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  BYTE *pBVar6;
  BYTE *pBVar7;
  undefined8 uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  BYTE *iStart;
  long *plVar12;
  size_t sVar13;
  uint *puVar14;
  BYTE *pBVar15;
  seqDef *psVar16;
  byte bVar17;
  int iVar18;
  U32 UVar19;
  U32 UVar20;
  BYTE *pBVar21;
  BYTE *pBVar22;
  uint uVar23;
  long lVar24;
  int iVar25;
  int iVar26;
  uint uVar27;
  BYTE *pBVar28;
  long *plVar29;
  U32 UVar30;
  ulong uVar31;
  uint uVar32;
  uint uVar33;
  ulong uVar34;
  ulong uVar35;
  BYTE *litEnd;
  uint uVar36;
  int iVar37;
  U32 UVar38;
  bool bVar39;
  ulong local_138;
  long *local_110;
  U32 *local_108;
  ulong local_100;
  ulong local_f8;
  ulong local_f0;
  BYTE *local_d8;
  U32 *local_d0;
  long *local_c0;
  U32 maxDistance;
  BYTE *litLimit_w;
  
  pBVar6 = (ms->window).base;
  pBVar7 = (ms->window).dictBase;
  uVar4 = (ms->window).dictLimit;
  iStart = pBVar6 + uVar4;
  pBVar28 = pBVar7 + uVar4;
  uVar5 = (ms->window).lowLimit;
  UVar38 = *rep;
  local_110 = (long *)((ulong)(iStart == (BYTE *)src) + (long)src);
  uVar9 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  uVar36 = rep[1];
  iEnd = (BYTE *)((long)src + srcSize);
  plVar12 = (long *)((long)src + (srcSize - 8));
  ilimit_w = (long *)((long)src + (srcSize - 0x20));
  iVar18 = uVar4 - 1;
LAB_005a7d78:
  do {
    if (plVar12 <= local_110) {
      *rep = UVar38;
      rep[1] = uVar36;
      return (long)iEnd - (long)src;
    }
    iVar37 = (int)local_110 - (int)pBVar6;
    iVar10 = iVar37 + 1;
    UVar30 = (ms->window).lowLimit;
    UVar20 = ms->loadedDictEnd;
    UVar19 = iVar10 - uVar9;
    if (iVar10 - UVar30 <= uVar9) {
      UVar19 = UVar30;
    }
    if (UVar20 != 0) {
      UVar19 = UVar30;
    }
    uVar11 = iVar10 - UVar38;
    pBVar15 = pBVar6;
    if (uVar11 < uVar4) {
      pBVar15 = pBVar7;
    }
    if (iVar18 - uVar11 < 3) {
      local_f8 = 0;
    }
    else {
      local_f8 = 0;
      if (UVar38 < (iVar37 - UVar19) + 1) {
        if (*(int *)((long)local_110 + 1) == *(int *)(pBVar15 + uVar11)) {
          pBVar22 = iEnd;
          if (uVar11 < uVar4) {
            pBVar22 = pBVar28;
          }
          sVar13 = ZSTD_count_2segments
                             ((BYTE *)((long)local_110 + 5),(BYTE *)((long)(pBVar15 + uVar11) + 4),
                              iEnd,pBVar22,iStart);
          local_f8 = sVar13 + 4;
        }
        else {
          local_f8 = 0;
        }
      }
    }
    uVar11 = (ms->cParams).minMatch;
    if (uVar11 - 6 < 2) {
      bVar3 = (byte)(ms->cParams).chainLog;
      uVar27 = 1 << (bVar3 & 0x1f);
      local_d8 = (ms->window).base;
      pBVar15 = (ms->window).dictBase;
      uVar11 = (ms->window).dictLimit;
      local_f0 = (long)local_110 - (long)local_d8;
      uVar23 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
      uVar32 = (uint)local_f0;
      UVar19 = uVar32 - uVar23;
      if (uVar32 - UVar30 <= uVar23) {
        UVar19 = UVar30;
      }
      local_d0 = ms->chainTable;
      if (UVar20 != 0) {
        UVar19 = UVar30;
      }
      uVar23 = (ms->cParams).searchLog;
      local_108 = ms->hashTable;
      bVar17 = 0x40 - (char)(ms->cParams).hashLog;
      for (uVar31 = (ulong)ms->nextToUpdate; uVar31 < (local_f0 & 0xffffffff); uVar31 = uVar31 + 1)
      {
        uVar34 = (ulong)(*(long *)(local_d8 + uVar31) * -0x30e4432340650000) >> (bVar17 & 0x3f);
        local_d0[(uint)uVar31 & ~(-1 << (bVar3 & 0x1f))] = local_108[uVar34];
        local_108[uVar34] = (uint)uVar31;
      }
      uVar33 = uVar32 - uVar27;
      if (uVar32 < uVar27) {
        uVar33 = 0;
      }
      iVar10 = 1 << ((byte)uVar23 & 0x1f);
      ms->nextToUpdate = uVar32;
      lVar24 = *local_110;
      puVar14 = local_108 + ((ulong)(lVar24 * -0x30e4432340650000) >> (bVar17 & 0x3f));
      local_138 = 999999999;
      uVar31 = 3;
      while (bVar39 = iVar10 != 0, iVar10 = iVar10 + -1, uVar34 = uVar31, bVar39) {
        uVar23 = *puVar14;
        if (uVar23 < UVar19) break;
        if (uVar23 < uVar11) {
          if (*(int *)(pBVar15 + uVar23) == (int)lVar24) {
            sVar13 = ZSTD_count_2segments
                               ((BYTE *)((long)local_110 + 4),pBVar15 + (ulong)uVar23 + 4,iEnd,
                                pBVar15 + uVar11,local_d8 + uVar11);
            uVar34 = sVar13 + 4;
LAB_005a8110:
            if ((uVar31 < uVar34) &&
               (local_138 = (ulong)((uVar32 + 2) - uVar23), uVar31 = uVar34,
               (BYTE *)((long)local_110 + uVar34) == iEnd)) break;
          }
        }
        else if ((local_d8 + uVar23)[uVar31] == *(BYTE *)((long)local_110 + uVar31)) {
          uVar34 = ZSTD_count((BYTE *)local_110,local_d8 + uVar23,iEnd);
          goto LAB_005a8110;
        }
        uVar34 = uVar31;
        if (uVar23 <= uVar33) break;
        puVar14 = local_d0 + (uVar23 & uVar27 - 1);
      }
    }
    else if (uVar11 == 5) {
      bVar3 = (byte)(ms->cParams).chainLog;
      uVar27 = 1 << (bVar3 & 0x1f);
      local_d8 = (ms->window).base;
      pBVar15 = (ms->window).dictBase;
      uVar11 = (ms->window).dictLimit;
      local_f0 = (long)local_110 - (long)local_d8;
      uVar23 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
      uVar32 = (uint)local_f0;
      UVar19 = uVar32 - uVar23;
      if (uVar32 - UVar30 <= uVar23) {
        UVar19 = UVar30;
      }
      local_d0 = ms->chainTable;
      if (UVar20 != 0) {
        UVar19 = UVar30;
      }
      uVar23 = (ms->cParams).searchLog;
      local_108 = ms->hashTable;
      bVar17 = 0x40 - (char)(ms->cParams).hashLog;
      for (uVar31 = (ulong)ms->nextToUpdate; uVar31 < (local_f0 & 0xffffffff); uVar31 = uVar31 + 1)
      {
        uVar34 = (ulong)(*(long *)(local_d8 + uVar31) * -0x30e4432345000000) >> (bVar17 & 0x3f);
        local_d0[(uint)uVar31 & ~(-1 << (bVar3 & 0x1f))] = local_108[uVar34];
        local_108[uVar34] = (uint)uVar31;
      }
      uVar33 = uVar32 - uVar27;
      if (uVar32 < uVar27) {
        uVar33 = 0;
      }
      iVar10 = 1 << ((byte)uVar23 & 0x1f);
      ms->nextToUpdate = uVar32;
      lVar24 = *local_110;
      puVar14 = local_108 + ((ulong)(lVar24 * -0x30e4432345000000) >> (bVar17 & 0x3f));
      local_138 = 999999999;
      uVar31 = 3;
      while (bVar39 = iVar10 != 0, iVar10 = iVar10 + -1, uVar34 = uVar31, bVar39) {
        uVar23 = *puVar14;
        if (uVar23 < UVar19) break;
        if (uVar23 < uVar11) {
          if (*(int *)(pBVar15 + uVar23) == (int)lVar24) {
            sVar13 = ZSTD_count_2segments
                               ((BYTE *)((long)local_110 + 4),pBVar15 + (ulong)uVar23 + 4,iEnd,
                                pBVar15 + uVar11,local_d8 + uVar11);
            uVar34 = sVar13 + 4;
LAB_005a8308:
            if ((uVar31 < uVar34) &&
               (local_138 = (ulong)((uVar32 + 2) - uVar23), uVar31 = uVar34,
               (BYTE *)((long)local_110 + uVar34) == iEnd)) break;
          }
        }
        else if ((local_d8 + uVar23)[uVar31] == *(BYTE *)((long)local_110 + uVar31)) {
          uVar34 = ZSTD_count((BYTE *)local_110,local_d8 + uVar23,iEnd);
          goto LAB_005a8308;
        }
        uVar34 = uVar31;
        if (uVar23 <= uVar33) break;
        puVar14 = local_d0 + (uVar23 & uVar27 - 1);
      }
    }
    else {
      bVar3 = (byte)(ms->cParams).chainLog;
      uVar27 = 1 << (bVar3 & 0x1f);
      local_d8 = (ms->window).base;
      pBVar15 = (ms->window).dictBase;
      uVar11 = (ms->window).dictLimit;
      local_f0 = (long)local_110 - (long)local_d8;
      uVar23 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
      uVar32 = (uint)local_f0;
      UVar19 = uVar32 - uVar23;
      if (uVar32 - UVar30 <= uVar23) {
        UVar19 = UVar30;
      }
      local_d0 = ms->chainTable;
      if (UVar20 != 0) {
        UVar19 = UVar30;
      }
      uVar23 = (ms->cParams).searchLog;
      local_108 = ms->hashTable;
      bVar17 = 0x20 - (char)(ms->cParams).hashLog;
      for (uVar31 = (ulong)ms->nextToUpdate; uVar31 < (local_f0 & 0xffffffff); uVar31 = uVar31 + 1)
      {
        uVar33 = (uint)(*(int *)(local_d8 + uVar31) * -0x61c8864f) >> (bVar17 & 0x1f);
        local_d0[(uint)uVar31 & ~(-1 << (bVar3 & 0x1f))] = local_108[uVar33];
        local_108[uVar33] = (uint)uVar31;
      }
      uVar33 = uVar32 - uVar27;
      if (uVar32 < uVar27) {
        uVar33 = 0;
      }
      iVar10 = 1 << ((byte)uVar23 & 0x1f);
      ms->nextToUpdate = uVar32;
      lVar24 = *local_110;
      puVar14 = local_108 + ((uint)((int)lVar24 * -0x61c8864f) >> (bVar17 & 0x1f));
      local_138 = 999999999;
      uVar31 = 3;
      while (bVar39 = iVar10 != 0, iVar10 = iVar10 + -1, uVar34 = uVar31, bVar39) {
        uVar23 = *puVar14;
        if (uVar23 < UVar19) break;
        if (uVar23 < uVar11) {
          if (*(int *)(pBVar15 + uVar23) == (int)lVar24) {
            sVar13 = ZSTD_count_2segments
                               ((BYTE *)((long)local_110 + 4),pBVar15 + (ulong)uVar23 + 4,iEnd,
                                pBVar15 + uVar11,local_d8 + uVar11);
            uVar34 = sVar13 + 4;
LAB_005a843f:
            if ((uVar31 < uVar34) &&
               (local_138 = (ulong)((uVar32 + 2) - uVar23), uVar31 = uVar34,
               (BYTE *)((long)local_110 + uVar34) == iEnd)) break;
          }
        }
        else if ((local_d8 + uVar23)[uVar31] == *(BYTE *)((long)local_110 + uVar31)) {
          uVar34 = ZSTD_count((BYTE *)local_110,local_d8 + uVar23,iEnd);
          goto LAB_005a843f;
        }
        uVar34 = uVar31;
        if (uVar23 <= uVar33) break;
        puVar14 = local_d0 + (uVar23 & uVar27 - 1);
      }
    }
    uVar31 = local_f8;
    if (local_f8 < uVar34) {
      uVar31 = uVar34;
    }
    if (uVar31 < 4) {
      local_110 = (long *)((long)local_110 + ((long)local_110 - (long)src >> 8) + 1);
      goto LAB_005a7d78;
    }
    plVar1 = local_110;
    if (uVar34 <= local_f8) {
      local_138 = 0;
      local_110 = (long *)((long)local_110 + 1);
    }
LAB_005a84fd:
    do {
      iVar10 = iVar37;
      plVar29 = plVar1;
      uVar34 = local_138;
      local_100 = uVar31;
      if (plVar12 <= plVar29) {
        local_c0 = local_110;
        break;
      }
      plVar1 = (long *)((long)plVar29 + 1);
      iVar37 = iVar10 + 1;
      if (local_138 == 0) {
        uVar34 = 0;
LAB_005a8655:
        local_c0 = local_110;
      }
      else {
        UVar30 = (ms->window).lowLimit;
        UVar20 = iVar37 - uVar9;
        if (iVar37 - UVar30 <= uVar9) {
          UVar20 = UVar30;
        }
        if (ms->loadedDictEnd != 0) {
          UVar20 = UVar30;
        }
        uVar11 = iVar37 - UVar38;
        pBVar22 = pBVar6;
        if (uVar11 < uVar4) {
          pBVar22 = pBVar7;
        }
        if ((iVar18 - uVar11 < 3) || (iVar37 - UVar20 <= UVar38)) goto LAB_005a8655;
        if (*(int *)plVar1 == *(int *)(pBVar22 + uVar11)) {
          pBVar21 = iEnd;
          if (uVar11 < uVar4) {
            pBVar21 = pBVar28;
          }
          sVar13 = ZSTD_count_2segments
                             ((BYTE *)((long)plVar29 + 5),(BYTE *)((long)(pBVar22 + uVar11) + 4),
                              iEnd,pBVar21,iStart);
          if (sVar13 < 0xfffffffffffffffc) {
            uVar23 = (int)local_138 + 1;
            uVar11 = 0x1f;
            if (uVar23 != 0) {
              for (; uVar23 >> uVar11 == 0; uVar11 = uVar11 - 1) {
              }
            }
            local_c0 = local_110;
            if ((int)((uVar11 ^ 0x1f) + (int)uVar31 * 3 + -0x1e) < (int)(sVar13 + 4) * 3) {
              uVar34 = 0;
              local_100 = sVar13 + 4;
              local_c0 = plVar1;
            }
          }
          else {
            local_c0 = local_110;
          }
        }
        else {
          local_c0 = local_110;
        }
      }
      uVar11 = (ms->cParams).minMatch;
      uVar31 = local_f0 & 0xffffffff;
      if (uVar11 - 6 < 2) {
        bVar3 = (byte)(ms->cParams).chainLog;
        uVar23 = 1 << (bVar3 & 0x1f);
        uVar11 = (ms->window).dictLimit;
        UVar30 = (ms->window).lowLimit;
        local_f0 = (long)plVar1 - (long)local_d8;
        uVar27 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
        uVar32 = (uint)local_f0;
        UVar20 = uVar32 - uVar27;
        if (uVar32 - UVar30 <= uVar27) {
          UVar20 = UVar30;
        }
        if (ms->loadedDictEnd != 0) {
          UVar20 = UVar30;
        }
        uVar27 = (ms->cParams).searchLog;
        bVar17 = 0x40 - (char)(ms->cParams).hashLog;
        for (; uVar31 < (local_f0 & 0xffffffff); uVar31 = uVar31 + 1) {
          uVar35 = (ulong)(*(long *)(local_d8 + uVar31) * -0x30e4432340650000) >> (bVar17 & 0x3f);
          local_d0[(uint)uVar31 & ~(-1 << (bVar3 & 0x1f))] = local_108[uVar35];
          local_108[uVar35] = (uint)uVar31;
        }
        uVar33 = uVar32 - uVar23;
        if (uVar32 < uVar23) {
          uVar33 = 0;
        }
        iVar25 = 1 << ((byte)uVar27 & 0x1f);
        ms->nextToUpdate = uVar32;
        lVar24 = *(long *)((long)plVar29 + 1);
        puVar14 = local_108 + ((ulong)(lVar24 * -0x30e4432340650000) >> (bVar17 & 0x3f));
        local_138 = 999999999;
        uVar35 = 3;
        while (bVar39 = iVar25 != 0, iVar25 = iVar25 + -1, uVar31 = uVar35, bVar39) {
          uVar27 = *puVar14;
          if (uVar27 < UVar20) break;
          if (uVar27 < uVar11) {
            if (*(int *)(pBVar15 + uVar27) == (int)lVar24) {
              sVar13 = ZSTD_count_2segments
                                 ((BYTE *)((long)plVar29 + 5),pBVar15 + (ulong)uVar27 + 4,iEnd,
                                  pBVar15 + uVar11,local_d8 + uVar11);
              uVar31 = sVar13 + 4;
LAB_005a88d7:
              if ((uVar35 < uVar31) &&
                 (local_138 = (ulong)((uVar32 + 2) - uVar27), uVar35 = uVar31,
                 (BYTE *)((long)plVar1 + uVar31) == iEnd)) break;
            }
          }
          else if ((local_d8 + uVar27)[uVar35] == *(BYTE *)((long)plVar1 + uVar35)) {
            uVar31 = ZSTD_count((BYTE *)plVar1,local_d8 + uVar27,iEnd);
            goto LAB_005a88d7;
          }
          uVar31 = uVar35;
          if (uVar27 <= uVar33) break;
          puVar14 = local_d0 + (uVar27 & uVar23 - 1);
        }
      }
      else if (uVar11 == 5) {
        bVar3 = (byte)(ms->cParams).chainLog;
        uVar23 = 1 << (bVar3 & 0x1f);
        uVar11 = (ms->window).dictLimit;
        UVar30 = (ms->window).lowLimit;
        local_f0 = (long)plVar1 - (long)local_d8;
        uVar27 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
        uVar32 = (uint)local_f0;
        UVar20 = uVar32 - uVar27;
        if (uVar32 - UVar30 <= uVar27) {
          UVar20 = UVar30;
        }
        if (ms->loadedDictEnd != 0) {
          UVar20 = UVar30;
        }
        uVar27 = (ms->cParams).searchLog;
        bVar17 = 0x40 - (char)(ms->cParams).hashLog;
        for (; uVar31 < (local_f0 & 0xffffffff); uVar31 = uVar31 + 1) {
          uVar35 = (ulong)(*(long *)(local_d8 + uVar31) * -0x30e4432345000000) >> (bVar17 & 0x3f);
          local_d0[(uint)uVar31 & ~(-1 << (bVar3 & 0x1f))] = local_108[uVar35];
          local_108[uVar35] = (uint)uVar31;
        }
        uVar33 = uVar32 - uVar23;
        if (uVar32 < uVar23) {
          uVar33 = 0;
        }
        iVar25 = 1 << ((byte)uVar27 & 0x1f);
        ms->nextToUpdate = uVar32;
        lVar24 = *(long *)((long)plVar29 + 1);
        puVar14 = local_108 + ((ulong)(lVar24 * -0x30e4432345000000) >> (bVar17 & 0x3f));
        local_138 = 999999999;
        uVar35 = 3;
        while (bVar39 = iVar25 != 0, iVar25 = iVar25 + -1, uVar31 = uVar35, bVar39) {
          uVar27 = *puVar14;
          if (uVar27 < UVar20) break;
          if (uVar27 < uVar11) {
            if (*(int *)(pBVar15 + uVar27) == (int)lVar24) {
              sVar13 = ZSTD_count_2segments
                                 ((BYTE *)((long)plVar29 + 5),pBVar15 + (ulong)uVar27 + 4,iEnd,
                                  pBVar15 + uVar11,local_d8 + uVar11);
              uVar31 = sVar13 + 4;
LAB_005a8ab0:
              if ((uVar35 < uVar31) &&
                 (local_138 = (ulong)((uVar32 + 2) - uVar27), uVar35 = uVar31,
                 (BYTE *)((long)plVar1 + uVar31) == iEnd)) break;
            }
          }
          else if ((local_d8 + uVar27)[uVar35] == *(BYTE *)((long)plVar1 + uVar35)) {
            uVar31 = ZSTD_count((BYTE *)plVar1,local_d8 + uVar27,iEnd);
            goto LAB_005a8ab0;
          }
          uVar31 = uVar35;
          if (uVar27 <= uVar33) break;
          puVar14 = local_d0 + (uVar27 & uVar23 - 1);
        }
      }
      else {
        bVar3 = (byte)(ms->cParams).chainLog;
        uVar23 = 1 << (bVar3 & 0x1f);
        uVar11 = (ms->window).dictLimit;
        UVar30 = (ms->window).lowLimit;
        local_f0 = (long)plVar1 - (long)local_d8;
        uVar27 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
        uVar32 = (uint)local_f0;
        UVar20 = uVar32 - uVar27;
        if (uVar32 - UVar30 <= uVar27) {
          UVar20 = UVar30;
        }
        if (ms->loadedDictEnd != 0) {
          UVar20 = UVar30;
        }
        uVar27 = (ms->cParams).searchLog;
        bVar17 = 0x20 - (char)(ms->cParams).hashLog;
        for (; uVar31 < (local_f0 & 0xffffffff); uVar31 = uVar31 + 1) {
          uVar33 = (uint)(*(int *)(local_d8 + uVar31) * -0x61c8864f) >> (bVar17 & 0x1f);
          local_d0[(uint)uVar31 & ~(-1 << (bVar3 & 0x1f))] = local_108[uVar33];
          local_108[uVar33] = (uint)uVar31;
        }
        uVar33 = uVar32 - uVar23;
        if (uVar32 < uVar23) {
          uVar33 = 0;
        }
        iVar26 = 1 << ((byte)uVar27 & 0x1f);
        ms->nextToUpdate = uVar32;
        iVar25 = *(int *)((long)plVar29 + 1);
        puVar14 = local_108 + ((uint)(iVar25 * -0x61c8864f) >> (bVar17 & 0x1f));
        local_138 = 999999999;
        uVar35 = 3;
        while (bVar39 = iVar26 != 0, iVar26 = iVar26 + -1, uVar31 = uVar35, bVar39) {
          uVar27 = *puVar14;
          if (uVar27 < UVar20) break;
          if (uVar27 < uVar11) {
            if (*(int *)(pBVar15 + uVar27) == iVar25) {
              sVar13 = ZSTD_count_2segments
                                 ((BYTE *)((long)plVar29 + 5),pBVar15 + (ulong)uVar27 + 4,iEnd,
                                  pBVar15 + uVar11,local_d8 + uVar11);
              uVar31 = sVar13 + 4;
LAB_005a8be0:
              if ((uVar35 < uVar31) &&
                 (local_138 = (ulong)((uVar32 + 2) - uVar27), uVar35 = uVar31,
                 (BYTE *)((long)plVar1 + uVar31) == iEnd)) break;
            }
          }
          else if ((local_d8 + uVar27)[uVar35] == *(BYTE *)((long)plVar1 + uVar35)) {
            uVar31 = ZSTD_count((BYTE *)plVar1,local_d8 + uVar27,iEnd);
            goto LAB_005a8be0;
          }
          uVar31 = uVar35;
          if (uVar27 <= uVar33) break;
          puVar14 = local_d0 + (uVar27 & uVar23 - 1);
        }
      }
      if (3 < uVar31) {
        uVar23 = (int)uVar34 + 1;
        uVar11 = 0x1f;
        if (uVar23 != 0) {
          for (; uVar23 >> uVar11 == 0; uVar11 = uVar11 - 1) {
          }
        }
        uVar23 = (int)local_138 + 1;
        iVar25 = 0x1f;
        if (uVar23 != 0) {
          for (; uVar23 >> iVar25 == 0; iVar25 = iVar25 + -1) {
          }
        }
        local_110 = plVar1;
        if ((int)((uVar11 ^ 0x1f) + (int)local_100 * 4 + -0x1b) < (int)uVar31 * 4 - iVar25)
        goto LAB_005a84fd;
      }
      if (plVar12 <= plVar1) break;
      plVar1 = (long *)((long)plVar29 + 2);
      iVar37 = iVar10 + 2;
      if (uVar34 == 0) {
        uVar34 = 0;
      }
      else {
        UVar30 = (ms->window).lowLimit;
        UVar20 = iVar37 - uVar9;
        if (iVar37 - UVar30 <= uVar9) {
          UVar20 = UVar30;
        }
        if (ms->loadedDictEnd != 0) {
          UVar20 = UVar30;
        }
        uVar11 = iVar37 - UVar38;
        pBVar22 = pBVar6;
        if (uVar11 < uVar4) {
          pBVar22 = pBVar7;
        }
        if (((2 < iVar18 - uVar11) && (UVar38 < iVar37 - UVar20)) &&
           (*(int *)plVar1 == *(int *)(pBVar22 + uVar11))) {
          pBVar21 = iEnd;
          if (uVar11 < uVar4) {
            pBVar21 = pBVar28;
          }
          sVar13 = ZSTD_count_2segments
                             ((BYTE *)((long)plVar29 + 6),(BYTE *)((long)(pBVar22 + uVar11) + 4),
                              iEnd,pBVar21,iStart);
          if (sVar13 < 0xfffffffffffffffc) {
            uVar23 = (int)uVar34 + 1;
            uVar11 = 0x1f;
            if (uVar23 != 0) {
              for (; uVar23 >> uVar11 == 0; uVar11 = uVar11 - 1) {
              }
            }
            if ((int)((uVar11 ^ 0x1f) + (int)local_100 * 4 + -0x1e) < (int)(sVar13 + 4) * 4) {
              uVar34 = 0;
              local_100 = sVar13 + 4;
              local_c0 = plVar1;
            }
          }
        }
      }
      uVar11 = (ms->cParams).minMatch;
      uVar31 = local_f0 & 0xffffffff;
      if (uVar11 - 6 < 2) {
        bVar3 = (byte)(ms->cParams).chainLog;
        uVar23 = 1 << (bVar3 & 0x1f);
        uVar11 = (ms->window).dictLimit;
        UVar30 = (ms->window).lowLimit;
        local_f0 = (long)plVar1 - (long)local_d8;
        uVar27 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
        uVar32 = (uint)local_f0;
        UVar20 = uVar32 - uVar27;
        if (uVar32 - UVar30 <= uVar27) {
          UVar20 = UVar30;
        }
        if (ms->loadedDictEnd != 0) {
          UVar20 = UVar30;
        }
        uVar27 = (ms->cParams).searchLog;
        bVar17 = 0x40 - (char)(ms->cParams).hashLog;
        for (; uVar31 < (local_f0 & 0xffffffff); uVar31 = uVar31 + 1) {
          uVar35 = (ulong)(*(long *)(local_d8 + uVar31) * -0x30e4432340650000) >> (bVar17 & 0x3f);
          local_d0[(uint)uVar31 & ~(-1 << (bVar3 & 0x1f))] = local_108[uVar35];
          local_108[uVar35] = (uint)uVar31;
        }
        uVar33 = uVar32 - uVar23;
        if (uVar32 < uVar23) {
          uVar33 = 0;
        }
        iVar10 = 1 << ((byte)uVar27 & 0x1f);
        ms->nextToUpdate = uVar32;
        lVar24 = *(long *)((long)plVar29 + 2);
        puVar14 = local_108 + ((ulong)(lVar24 * -0x30e4432340650000) >> (bVar17 & 0x3f));
        local_138 = 999999999;
        uVar35 = 3;
        while (bVar39 = iVar10 != 0, iVar10 = iVar10 + -1, uVar31 = uVar35, bVar39) {
          uVar27 = *puVar14;
          if (uVar27 < UVar20) break;
          if (uVar27 < uVar11) {
            if (*(int *)(pBVar15 + uVar27) == (int)lVar24) {
              sVar13 = ZSTD_count_2segments
                                 ((BYTE *)((long)plVar29 + 6),pBVar15 + (ulong)uVar27 + 4,iEnd,
                                  pBVar15 + uVar11,local_d8 + uVar11);
              uVar31 = sVar13 + 4;
LAB_005a9032:
              if ((uVar35 < uVar31) &&
                 (local_138 = (ulong)((uVar32 + 2) - uVar27), uVar35 = uVar31,
                 (BYTE *)((long)plVar1 + uVar31) == iEnd)) break;
            }
          }
          else if ((local_d8 + uVar27)[uVar35] == *(BYTE *)((long)plVar1 + uVar35)) {
            uVar31 = ZSTD_count((BYTE *)plVar1,local_d8 + uVar27,iEnd);
            goto LAB_005a9032;
          }
          uVar31 = uVar35;
          if (uVar27 <= uVar33) break;
          puVar14 = local_d0 + (uVar27 & uVar23 - 1);
        }
      }
      else if (uVar11 == 5) {
        bVar3 = (byte)(ms->cParams).chainLog;
        uVar23 = 1 << (bVar3 & 0x1f);
        uVar11 = (ms->window).dictLimit;
        UVar30 = (ms->window).lowLimit;
        local_f0 = (long)plVar1 - (long)local_d8;
        uVar27 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
        uVar32 = (uint)local_f0;
        UVar20 = uVar32 - uVar27;
        if (uVar32 - UVar30 <= uVar27) {
          UVar20 = UVar30;
        }
        if (ms->loadedDictEnd != 0) {
          UVar20 = UVar30;
        }
        uVar27 = (ms->cParams).searchLog;
        bVar17 = 0x40 - (char)(ms->cParams).hashLog;
        for (; uVar31 < (local_f0 & 0xffffffff); uVar31 = uVar31 + 1) {
          uVar35 = (ulong)(*(long *)(local_d8 + uVar31) * -0x30e4432345000000) >> (bVar17 & 0x3f);
          local_d0[(uint)uVar31 & ~(-1 << (bVar3 & 0x1f))] = local_108[uVar35];
          local_108[uVar35] = (uint)uVar31;
        }
        uVar33 = uVar32 - uVar23;
        if (uVar32 < uVar23) {
          uVar33 = 0;
        }
        iVar10 = 1 << ((byte)uVar27 & 0x1f);
        ms->nextToUpdate = uVar32;
        lVar24 = *(long *)((long)plVar29 + 2);
        puVar14 = local_108 + ((ulong)(lVar24 * -0x30e4432345000000) >> (bVar17 & 0x3f));
        local_138 = 999999999;
        uVar35 = 3;
        while (bVar39 = iVar10 != 0, iVar10 = iVar10 + -1, uVar31 = uVar35, bVar39) {
          uVar27 = *puVar14;
          if (uVar27 < UVar20) break;
          if (uVar27 < uVar11) {
            if (*(int *)(pBVar15 + uVar27) == (int)lVar24) {
              sVar13 = ZSTD_count_2segments
                                 ((BYTE *)((long)plVar29 + 6),pBVar15 + (ulong)uVar27 + 4,iEnd,
                                  pBVar15 + uVar11,local_d8 + uVar11);
              uVar31 = sVar13 + 4;
LAB_005a9206:
              if ((uVar35 < uVar31) &&
                 (local_138 = (ulong)((uVar32 + 2) - uVar27), uVar35 = uVar31,
                 (BYTE *)((long)plVar1 + uVar31) == iEnd)) break;
            }
          }
          else if ((local_d8 + uVar27)[uVar35] == *(BYTE *)((long)plVar1 + uVar35)) {
            uVar31 = ZSTD_count((BYTE *)plVar1,local_d8 + uVar27,iEnd);
            goto LAB_005a9206;
          }
          uVar31 = uVar35;
          if (uVar27 <= uVar33) break;
          puVar14 = local_d0 + (uVar27 & uVar23 - 1);
        }
      }
      else {
        bVar3 = (byte)(ms->cParams).chainLog;
        uVar23 = 1 << (bVar3 & 0x1f);
        uVar11 = (ms->window).dictLimit;
        UVar30 = (ms->window).lowLimit;
        local_f0 = (long)plVar1 - (long)local_d8;
        uVar27 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
        uVar32 = (uint)local_f0;
        UVar20 = uVar32 - uVar27;
        if (uVar32 - UVar30 <= uVar27) {
          UVar20 = UVar30;
        }
        if (ms->loadedDictEnd != 0) {
          UVar20 = UVar30;
        }
        uVar27 = (ms->cParams).searchLog;
        bVar17 = 0x20 - (char)(ms->cParams).hashLog;
        for (; uVar31 < (local_f0 & 0xffffffff); uVar31 = uVar31 + 1) {
          uVar33 = (uint)(*(int *)(local_d8 + uVar31) * -0x61c8864f) >> (bVar17 & 0x1f);
          local_d0[(uint)uVar31 & ~(-1 << (bVar3 & 0x1f))] = local_108[uVar33];
          local_108[uVar33] = (uint)uVar31;
        }
        uVar33 = uVar32 - uVar23;
        if (uVar32 < uVar23) {
          uVar33 = 0;
        }
        iVar25 = 1 << ((byte)uVar27 & 0x1f);
        ms->nextToUpdate = uVar32;
        iVar10 = *(int *)((long)plVar29 + 2);
        puVar14 = local_108 + ((uint)(iVar10 * -0x61c8864f) >> (bVar17 & 0x1f));
        local_138 = 999999999;
        uVar35 = 3;
        while (bVar39 = iVar25 != 0, iVar25 = iVar25 + -1, uVar31 = uVar35, bVar39) {
          uVar27 = *puVar14;
          if (uVar27 < UVar20) break;
          if (uVar27 < uVar11) {
            if (*(int *)(pBVar15 + uVar27) == iVar10) {
              sVar13 = ZSTD_count_2segments
                                 ((BYTE *)((long)plVar29 + 6),pBVar15 + (ulong)uVar27 + 4,iEnd,
                                  pBVar15 + uVar11,local_d8 + uVar11);
              uVar31 = sVar13 + 4;
LAB_005a9334:
              if ((uVar35 < uVar31) &&
                 (local_138 = (ulong)((uVar32 + 2) - uVar27), uVar35 = uVar31,
                 (BYTE *)((long)plVar1 + uVar31) == iEnd)) break;
            }
          }
          else if ((local_d8 + uVar27)[uVar35] == *(BYTE *)((long)plVar1 + uVar35)) {
            uVar31 = ZSTD_count((BYTE *)plVar1,local_d8 + uVar27,iEnd);
            goto LAB_005a9334;
          }
          uVar31 = uVar35;
          if (uVar27 <= uVar33) break;
          puVar14 = local_d0 + (uVar27 & uVar23 - 1);
        }
      }
      if (uVar31 < 4) break;
      uVar23 = (int)uVar34 + 1;
      uVar11 = 0x1f;
      if (uVar23 != 0) {
        for (; uVar23 >> uVar11 == 0; uVar11 = uVar11 - 1) {
        }
      }
      uVar23 = (int)local_138 + 1;
      iVar10 = 0x1f;
      if (uVar23 != 0) {
        for (; uVar23 >> iVar10 == 0; iVar10 = iVar10 + -1) {
        }
      }
      local_110 = plVar1;
    } while ((int)((uVar11 ^ 0x1f) + (int)local_100 * 4 + -0x18) < (int)uVar31 * 4 - iVar10);
    if (uVar34 == 0) {
      UVar30 = 1;
      uVar11 = UVar38;
    }
    else {
      pBVar21 = (BYTE *)((long)local_c0 + (-(long)pBVar6 - uVar34) + 2);
      pBVar22 = iStart;
      pBVar15 = pBVar6;
      if ((uint)pBVar21 < uVar4) {
        pBVar22 = pBVar7 + uVar5;
        pBVar15 = pBVar7;
      }
      pBVar15 = pBVar15 + ((ulong)pBVar21 & 0xffffffff);
      for (; ((src < local_c0 && (pBVar22 < pBVar15)) &&
             (*(BYTE *)((long)local_c0 + -1) == pBVar15[-1]));
          local_c0 = (long *)((long)local_c0 + -1)) {
        pBVar15 = pBVar15 + -1;
        local_100 = local_100 + 1;
      }
      UVar30 = (int)uVar34 + 1;
      uVar11 = (int)uVar34 - 2;
      uVar36 = UVar38;
    }
    uVar31 = (long)local_c0 - (long)src;
    plVar1 = (long *)seqStore->lit;
    if (ilimit_w < local_c0) {
      ZSTD_safecopyLiterals((BYTE *)plVar1,(BYTE *)src,(BYTE *)local_c0,(BYTE *)ilimit_w);
LAB_005a94f6:
      seqStore->lit = seqStore->lit + uVar31;
      psVar16 = seqStore->sequences;
      if (0xffff < uVar31) {
        seqStore->longLengthType = ZSTD_llt_literalLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar16 - (long)seqStore->sequencesStart) >> 3);
      }
    }
    else {
      lVar24 = *(long *)((long)src + 8);
      *plVar1 = *src;
      plVar1[1] = lVar24;
      pBVar15 = seqStore->lit;
      if (0x10 < uVar31) {
        lVar24 = *(long *)((long)src + 0x18);
        *(long *)(pBVar15 + 0x10) = *(long *)((long)src + 0x10);
        *(long *)(pBVar15 + 0x18) = lVar24;
        if (0x20 < (long)uVar31) {
          lVar24 = 0;
          do {
            puVar2 = (undefined8 *)((long)src + lVar24 + 0x20);
            uVar8 = puVar2[1];
            pBVar22 = pBVar15 + lVar24 + 0x20;
            *(undefined8 *)pBVar22 = *puVar2;
            *(undefined8 *)(pBVar22 + 8) = uVar8;
            puVar2 = (undefined8 *)((long)src + lVar24 + 0x30);
            uVar8 = puVar2[1];
            *(undefined8 *)(pBVar22 + 0x10) = *puVar2;
            *(undefined8 *)(pBVar22 + 0x18) = uVar8;
            lVar24 = lVar24 + 0x20;
          } while (pBVar22 + 0x20 < pBVar15 + uVar31);
        }
        goto LAB_005a94f6;
      }
      seqStore->lit = pBVar15 + uVar31;
      psVar16 = seqStore->sequences;
    }
    psVar16->litLength = (U16)uVar31;
    psVar16->offset = UVar30;
    if (0xffff < local_100 - 3) {
      seqStore->longLengthType = ZSTD_llt_matchLength;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar16 - (long)seqStore->sequencesStart) >> 3);
    }
    psVar16->matchLength = (U16)(local_100 - 3);
    seqStore->sequences = psVar16 + 1;
    for (local_110 = (long *)((long)local_c0 + local_100); UVar38 = uVar11, src = local_110,
        local_110 <= plVar12; local_110 = (long *)((long)local_110 + sVar13 + 4)) {
      iVar37 = (int)local_110 - (int)pBVar6;
      UVar30 = (ms->window).lowLimit;
      UVar20 = iVar37 - uVar9;
      if (iVar37 - UVar30 <= uVar9) {
        UVar20 = UVar30;
      }
      if (ms->loadedDictEnd != 0) {
        UVar20 = UVar30;
      }
      uVar11 = iVar37 - uVar36;
      pBVar15 = pBVar6;
      if (uVar11 < uVar4) {
        pBVar15 = pBVar7;
      }
      if (((iVar18 - uVar11 < 3) || (iVar37 - UVar20 <= uVar36)) ||
         ((int)*local_110 != *(int *)(pBVar15 + uVar11))) break;
      pBVar22 = iEnd;
      if (uVar11 < uVar4) {
        pBVar22 = pBVar28;
      }
      sVar13 = ZSTD_count_2segments
                         ((BYTE *)((long)local_110 + 4),(BYTE *)((long)(pBVar15 + uVar11) + 4),iEnd,
                          pBVar22,iStart);
      plVar1 = (long *)seqStore->lit;
      if (ilimit_w < local_110) {
        ZSTD_safecopyLiterals((BYTE *)plVar1,(BYTE *)local_110,(BYTE *)local_110,(BYTE *)ilimit_w);
      }
      else {
        lVar24 = local_110[1];
        *plVar1 = *local_110;
        plVar1[1] = lVar24;
      }
      psVar16 = seqStore->sequences;
      psVar16->litLength = 0;
      psVar16->offset = 1;
      if (0xffff < sVar13 + 1) {
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar16 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar16->matchLength = (U16)(sVar13 + 1);
      seqStore->sequences = psVar16 + 1;
      uVar11 = uVar36;
      uVar36 = UVar38;
    }
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_lazy2_extDict(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)

{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, src, srcSize, search_hashChain, 2);
}